

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O2

void update_last_qword_type(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *qword_types,int n)

{
  MIR_type_t MVar1;
  mir_size_t mVar2;
  ulong uVar3;
  
  mVar2 = type_size(c2m_ctx,type);
  uVar3 = mVar2 & 7;
  if (n < 2 && uVar3 != 0) {
    if ((uint)uVar3 < 5 && qword_types[(long)n + -1] == MIR_T_D) {
      MVar1 = MIR_T_F;
    }
    else {
      if (qword_types[(long)n + -1] != MIR_T_I64 || 4 < (uint)uVar3) {
        return;
      }
      MVar1 = (uVar3 != 2) + 2 + (uint)(uVar3 != 2);
      if (uVar3 < 2) {
        MVar1 = MIR_T_I8;
      }
    }
    qword_types[(long)n + -1] = MVar1;
  }
  return;
}

Assistant:

static void update_last_qword_type (c2m_ctx_t c2m_ctx, struct type *type,
                                    MIR_type_t qword_types[MAX_QWORDS], int n) {
  size_t last_size, size = type_size (c2m_ctx, type);
  MIR_type_t mir_type;

  assert (n != 0);
  if ((last_size = size % 8) == 0 || n > 1) return;
  mir_type = qword_types[n - 1];
  if (last_size <= 4 && mir_type == MIR_T_D) qword_types[n - 1] = MIR_T_F;
  if (last_size <= 4 && mir_type == MIR_T_I64)
    qword_types[n - 1] = last_size <= 1 ? MIR_T_I8 : last_size <= 2 ? MIR_T_I16 : MIR_T_I32;
}